

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void SimpleString::padStringsToSameLength(SimpleString *str1,SimpleString *str2,char padCharacter)

{
  size_t repeatCount;
  size_t sVar1;
  SimpleString *this;
  undefined1 in_DL;
  SimpleString *in_RSI;
  char pad [2];
  SimpleString *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffb8;
  SimpleString *in_stack_ffffffffffffffc0;
  SimpleString *in_stack_ffffffffffffffc8;
  char in_stack_ffffffffffffffe7;
  undefined5 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffed;
  undefined1 in_stack_ffffffffffffffee;
  
  repeatCount = size((SimpleString *)0x17210e);
  sVar1 = size((SimpleString *)0x17211d);
  if (sVar1 < repeatCount) {
    padStringsToSameLength
              (in_RSI,(SimpleString *)
                      CONCAT17(in_DL,CONCAT16(in_stack_ffffffffffffffee,
                                              CONCAT15(in_stack_ffffffffffffffed,
                                                       in_stack_ffffffffffffffe8))),
               in_stack_ffffffffffffffe7);
  }
  else {
    this = (SimpleString *)size((SimpleString *)0x172157);
    size((SimpleString *)0x172166);
    SimpleString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,repeatCount);
    operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    operator=(this,in_stack_ffffffffffffff98);
    ~SimpleString((SimpleString *)0x1721b3);
    ~SimpleString((SimpleString *)0x1721bd);
  }
  return;
}

Assistant:

void SimpleString::padStringsToSameLength(SimpleString& str1, SimpleString& str2, char padCharacter)
{
    if (str1.size() > str2.size()) {
        padStringsToSameLength(str2, str1, padCharacter);
        return;
    }

    char pad[2];
    pad[0] = padCharacter;
    pad[1] = 0;
    str1 = SimpleString(pad, str2.size() - str1.size()) + str1;
}